

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O0

vector<char_*,_std::allocator<char_*>_> * absl::ParseCommandLine(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  bool *pbVar3;
  int in_ESI;
  vector<char_*,_std::allocator<char_*>_> *in_RDI;
  int i;
  anon_class_1_0_00000001 set_flag;
  string value;
  string key;
  int used_argc;
  undefined4 in_stack_00000108;
  vector<char_*,_std::allocator<char_*>_> *output_args;
  string *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff08;
  size_type in_stack_ffffffffffffff18;
  vector<char_*,_std::allocator<char_*>_> *in_stack_ffffffffffffff20;
  string local_c0 [32];
  string local_a0 [36];
  int local_7c;
  undefined1 local_61;
  int *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  char **in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  
  if (in_ESI == 0) {
    memset(in_RDI,0,0x18);
    std::vector<char_*,_std::allocator<char_*>_>::vector
              ((vector<char_*,_std::allocator<char_*>_> *)0x402200);
  }
  else {
    std::__cxx11::string::string((string *)&stack0xffffffffffffffc0);
    std::__cxx11::string::string((string *)&stack0xffffffffffffffa0);
    local_61 = 0;
    std::vector<char_*,_std::allocator<char_*>_>::vector
              ((vector<char_*,_std::allocator<char_*>_> *)0x40223c);
    std::vector<char_*,_std::allocator<char_*>_>::reserve
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::vector<char_*,_std::allocator<char_*>_>::push_back
              ((vector<char_*,_std::allocator<char_*>_> *)in_stack_ffffffffffffff00,
               (value_type *)in_stack_fffffffffffffef8);
    local_7c = 1;
    while (local_7c < in_ESI) {
      bVar1 = internal::anon_unknown_1::CommandLineGetFlag
                        (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                         in_stack_ffffffffffffffa0);
      if (bVar1) {
        bVar1 = ParseCommandLine::anon_class_1_0_00000001::operator()
                          (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                           in_stack_fffffffffffffef8);
        if (!bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"Unknown/Invalid flag ");
          poVar2 = std::operator<<(poVar2,(string *)&stack0xffffffffffffffc0);
          poVar2 = std::operator<<(poVar2,"\n\n");
          internal::(anonymous_namespace)::PrintHelp_abi_cxx11_
                    ((char *)CONCAT44(argc,in_stack_00000108));
          std::operator<<(poVar2,local_a0);
          std::__cxx11::string::~string(local_a0);
          sentencepiece::error::Exit(0);
        }
      }
      else {
        std::vector<char_*,_std::allocator<char_*>_>::push_back
                  ((vector<char_*,_std::allocator<char_*>_> *)in_stack_ffffffffffffff00,
                   (value_type *)in_stack_fffffffffffffef8);
      }
    }
    pbVar3 = GetFlag<bool>((Flag<bool> *)0x402414);
    if ((*pbVar3 & 1U) == 0) {
      pbVar3 = GetFlag<bool>((Flag<bool> *)0x402499);
      if ((*pbVar3 & 1U) != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"sentencepiece");
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = std::operator<<(poVar2,"0.2.1");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        sentencepiece::error::Exit(0);
      }
    }
    else {
      internal::(anonymous_namespace)::PrintHelp_abi_cxx11_
                ((char *)CONCAT44(argc,in_stack_00000108));
      std::operator<<((ostream *)&std::cout,local_c0);
      std::__cxx11::string::~string(local_c0);
      sentencepiece::error::Exit(0);
    }
    local_61 = 1;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  }
  return in_RDI;
}

Assistant:

std::vector<char *> ParseCommandLine(int argc, char *argv[]) {
  if (argc == 0) return {};

  int used_argc = 0;
  std::string key, value;
  std::vector<char *> output_args;
  output_args.reserve(argc);
  output_args.push_back(argv[0]);

  auto set_flag = [](const std::string &name, const std::string &value) {
    const auto *flag_map = internal::GetFlagMap();
    auto it = flag_map->find(name);
    if (it == flag_map->end()) return false;
    it->second->set_value(value);
    return true;
  };

  for (int i = 1; i < argc; i += used_argc) {
    if (!internal::CommandLineGetFlag(argc - i, argv + i, &key, &value,
                                      &used_argc)) {
      output_args.push_back(argv[i]);
      continue;
    }

    if (!set_flag(key, value)) {
      std::cerr << "Unknown/Invalid flag " << key << "\n\n"
                << internal::PrintHelp(argv[0]);
      sentencepiece::error::Exit(1);
    }
  }

  if (absl::GetFlag(FLAGS_help)) {
    std::cout << internal::PrintHelp(argv[0]);
    sentencepiece::error::Exit(1);
  } else if (absl::GetFlag(FLAGS_version)) {
    std::cout << PACKAGE_STRING << " " << VERSION << std::endl;
    sentencepiece::error::Exit(0);
  }

  return output_args;
}